

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerCheckIsFuncObj(Lowerer *this,Instr *instr,bool checkFuncInfo)

{
  RegOpnd *funcOpnd;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  BailOutKind bailOutKind;
  undefined4 *puVar4;
  BailOutInfo *bailOutInfo;
  Instr *this_00;
  Lowerer *pLVar5;
  char *this_01;
  
  funcOpnd = (RegOpnd *)instr->m_src1;
  OVar2 = IR::Opnd::GetKind((Opnd *)funcOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005bb8b9;
    *puVar4 = 0;
  }
  bailOutKind = IR::Instr::GetBailOutKind(instr);
  pLVar5 = (Lowerer *)instr;
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  InsertObjectCheck(pLVar5,funcOpnd,instr,bailOutKind,bailOutInfo);
  this_00 = InsertFunctionTypeIdCheck(pLVar5,funcOpnd,instr,bailOutKind,bailOutInfo);
  if (checkFuncInfo) {
    pLVar5 = (Lowerer *)instr->m_src2;
    this_01 = (char *)pLVar5;
    OVar2 = IR::Opnd::GetKind((Opnd *)pLVar5);
    if (OVar2 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      this_01 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar3) {
LAB_005bb8b9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    this_00 = InsertFunctionInfoCheck
                        ((Lowerer *)this_01,funcOpnd,instr,(AddrOpnd *)pLVar5,bailOutKind,
                         bailOutInfo);
    IR::Instr::SetByteCodeOffset(this_00,instr);
  }
  if (bailOutInfo->bailOutInstr == instr) {
    bailOutInfo->bailOutInstr = this_00;
  }
  instr->field_0x38 = instr->field_0x38 & 0xaf;
  IR::Instr::Remove(instr);
  return this_00;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckIsFuncObj(IR::Instr *instr, bool checkFuncInfo)
{
    // The CheckIsFuncObj instr and CheckFuncInfo instr (checkFuncInfo = true) are used to
    // generate bailout instrs that type check a function (and can also check the func info).
    // Rather than creating these bailout instrs in Inline, they are created in Lower because 
    // CheckIsFuncObj and CheckFuncInfo instrs can be hoisted outside of loops and thus the
    // bailout instrs created can exist outside of loops.

    IR::RegOpnd *funcOpnd = instr->GetSrc1()->AsRegOpnd();
    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    BailOutInfo *bailOutInfo = instr->GetBailOutInfo();

    // Check that the property is an object.
    InsertObjectCheck(funcOpnd, instr, bailOutKind, bailOutInfo);

    // Check that the object is a function with the correct type ID.
    IR::Instr *lastInstr = InsertFunctionTypeIdCheck(funcOpnd, instr, bailOutKind, bailOutInfo);

    if (checkFuncInfo)
    {
        // Check that the function body matches the func info.
        lastInstr = InsertFunctionInfoCheck(
            funcOpnd, instr, instr->GetSrc2()->AsAddrOpnd(), bailOutKind, bailOutInfo);
        lastInstr->SetByteCodeOffset(instr);
    }

    if (bailOutInfo->bailOutInstr == instr)
    {
        // bailOutInstr is currently instr. By changing bailOutInstr to point to lastInstr, the next
        // instruction to be lowered (lastInstr) will create the bailout target. This is necessary in
        // cases where instr does not have a shared bailout (ex: instr was not hoisted outside of a loop).
        bailOutInfo->bailOutInstr = lastInstr;
    }

    // the CheckFunctionEntryPoint instr exists in order to create the instrs above. It does not have
    // any other purpose and thus it is removed. The instr's BailOutInfo continues to be used and thus
    // must not be deleted. Flags are turned off to stop Remove() from deleting instr's BailOutInfo.
    instr->hasBailOutInfo = false;
    instr->hasAuxBailOut = false;
    instr->Remove();

    return lastInstr;
}